

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O1

void __thiscall CMacroTable::Add(CMacroTable *this,char *nnaam,char **p)

{
  ulong *puVar1;
  undefined8 uVar2;
  pointer pTVar3;
  bool bVar4;
  int iVar5;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>
  _Var6;
  char *pcVar7;
  undefined8 *puVar8;
  char *pcVar9;
  EStatus type;
  undefined8 *puVar10;
  undefined8 *puVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>,_bool>
  pVar12;
  allocator<char> local_71;
  undefined8 *local_70;
  CMacroTableEntry local_68;
  key_type local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,nnaam,&local_71);
  local_68.args = (CStringsList *)0x0;
  local_68.body = (CStringsList *)0x0;
  pVar12 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>_>
           ::try_emplace<CMacroTableEntry>(&this->macs,&local_50,&local_68);
  _Var6 = pVar12.first._M_node;
  CMacroTableEntry::~CMacroTableEntry(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pcVar7 = "Duplicate macroname";
    type = PASS3;
  }
  else {
    puVar1 = (ulong *)((long)(this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                      (ulong)(((byte)*nnaam & 0x40) >> 3));
    *puVar1 = *puVar1 | 1L << (*nnaam & 0x3fU);
    puVar8 = (undefined8 *)0x0;
    do {
      pcVar7 = GetID(p);
      if (pcVar7 == (char *)0x0) {
        if ((pass == 1) && ((puVar8 != (undefined8 *)0x0 || (**p != '\0')))) {
          Error("Illegal argument name",*p,EARLY);
        }
        SkipToEol(p);
      }
      else {
        puVar11 = puVar8;
        if (pass == 1) {
          puVar10 = *(undefined8 **)(_Var6._M_node + 2);
          local_70 = puVar8;
          while ((puVar10 != (undefined8 *)0x0 &&
                 (iVar5 = strcmp(pcVar7,(char *)*puVar10), iVar5 != 0))) {
            puVar10 = (undefined8 *)puVar10[1];
          }
          puVar11 = local_70;
          if (puVar10 != (undefined8 *)0x0) {
            Error("Duplicate argument name",pcVar7,EARLY);
          }
        }
        puVar8 = (undefined8 *)operator_new(0x28);
        puVar8[2] = 0;
        puVar8[3] = 0;
        *(undefined4 *)(puVar8 + 4) = 0;
        pcVar9 = strdup(pcVar7);
        *puVar8 = pcVar9;
        puVar8[1] = 0;
        pTVar3 = sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
            super__Vector_impl_data._M_start !=
            sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          *(uint32_t *)(puVar8 + 4) =
               sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].colEnd;
          uVar2 = *(undefined8 *)&pTVar3[-1].line;
          puVar8[2] = pTVar3[-1].filename;
          puVar8[3] = uVar2;
        }
        if (*(long *)(_Var6._M_node + 2) == 0) {
          *(undefined8 **)(_Var6._M_node + 2) = puVar8;
        }
        else {
          puVar11[1] = puVar8;
        }
      }
    } while ((pcVar7 != (char *)0x0) && (bVar4 = anyComma(p), bVar4));
    if ((pass == 1) && (**p != '\0')) {
      Error("Unexpected",*p,EARLY);
    }
    ListFile(false);
    iVar5 = ReadFileToCStringsList((CStringsList **)&_Var6._M_node[2]._M_parent,"endm");
    if (iVar5 != 0) {
      return;
    }
    pcVar7 = "Unexpected end of macro";
    nnaam = (char *)0x0;
    type = EARLY;
  }
  Error(pcVar7,nnaam,type);
  return;
}

Assistant:

void CMacroTable::Add(const char* nnaam, char*& p) {
	auto [add_it, is_new] = macs.try_emplace(nnaam, CMacroTableEntry());
	if (!is_new) {
		Error("Duplicate macroname", nnaam);
		return;
	}
	used[nnaam[0] & 127] = true;
	CStringsList* last = nullptr;
	do {
		char* n = GetID(p);
		if (!n) {
			// either EOL when no previous argument, or valid name is required after comma (2nd+ loop)
			if ((1 == pass) && (last || *p)) Error("Illegal argument name", p, EARLY);
			SkipToEol(p);
			break;
		}
		if ((1 == pass) && CStringsList::contains(add_it->second.args, n)) {
			Error("Duplicate argument name", n, EARLY);
		}
		CStringsList* argname = new CStringsList(n);
		if (!add_it->second.args) {
			add_it->second.args = argname;	// first argument name, make it head of list
		} else {
			last->next = argname;
		}
		last = argname;
	} while (anyComma(p));
	if ((1 == pass) && *p) {
		Error("Unexpected", p, EARLY);
	}
	ListFile();
	if (!ReadFileToCStringsList(add_it->second.body, "endm")) {
		Error("Unexpected end of macro", NULL, EARLY);
	}
}